

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

bool __thiscall storage::BTree::_erase_(BTree *this,int key,Record **out_record)

{
  BTNode *pBVar1;
  BTree *pBVar2;
  bool bVar3;
  int iVar4;
  BTInnerNode *pBVar5;
  BTLeafNode *pBVar6;
  long lVar7;
  int iVar8;
  BTInnerNode *this_00;
  bool err;
  int idx;
  bool err_1;
  BTNode *node;
  bool local_49;
  int local_48;
  bool local_41;
  BTree *local_40;
  BTNode *local_38;
  
  local_38 = this->root_;
  if (local_38 == (BTNode *)0x0) {
    local_41 = false;
  }
  else {
    local_40 = this;
    while (pBVar1 = local_38, iVar4 = (**local_38->_vptr_BTNode)(local_38), pBVar2 = local_40,
          (char)iVar4 == '\0') {
      pBVar5 = (BTInnerNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      BTInnerNode::search_node(pBVar5,key,&local_38);
    }
    if (pBVar1 == local_40->root_) {
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      iVar4 = (pBVar6->super_BTNode).used_links_count_;
      if (iVar4 < 3) {
        if (iVar4 != 2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xd4,"bool storage::BTree::_erase_(int, Record *&)");
        }
        *out_record = pBVar6->record_links_[0];
        operator_delete(pBVar2->root_,0xe0);
        pBVar2->root_ = (BTNode *)0x0;
        local_41 = true;
      }
      else {
        local_41 = false;
        BTLeafNode::erase_(pBVar6,key,out_record,&local_41);
        if ((local_41 == false) && (*out_record != (Record *)0x0)) {
          __assert_fail("out_record == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xc9,"bool storage::BTree::_erase_(int, Record *&)");
        }
      }
    }
    else {
      local_49 = false;
      if (pBVar1->parent_ == (BTNode *)0x0) {
        pBVar5 = (BTInnerNode *)0x0;
      }
      else {
        pBVar5 = (BTInnerNode *)
                 __dynamic_cast(pBVar1->parent_,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      iVar4 = BTLeafNode::erase_(pBVar6,key,out_record,&local_49);
      local_41 = local_49;
      local_48 = iVar4;
      if (local_49 == true) {
        while (this_00 = pBVar5, iVar4 != -1) {
          pBVar5 = (BTInnerNode *)0x0;
          if (this_00 != (BTInnerNode *)0x0) {
            pBVar1 = this_00->links_[(long)iVar4 + 1];
            pBVar5 = BTInnerNode::erase_(this_00,iVar4,&local_48);
            pBVar2 = local_40;
            iVar4 = local_48;
            if (local_48 != -1 && pBVar5 == (BTInnerNode *)0x0) {
              if (this_00 != (BTInnerNode *)local_40->root_) {
                __assert_fail("parent == root_",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                              ,0xe5,"bool storage::BTree::_erase_(int, Record *&)");
              }
              iVar8 = (this_00->super_BTNode).used_links_count_;
              if (2 < iVar8) {
                for (lVar7 = (long)local_48 + 6; lVar7 + -5 < (long)(iVar8 + -1); lVar7 = lVar7 + 1)
                {
                  (this_00->super_BTNode).keys_[lVar7 + -6] =
                       (this_00->super_BTNode).keys_[lVar7 + -5];
                  iVar8 = (this_00->super_BTNode).used_links_count_;
                }
                operator_delete(this_00->links_[(long)local_48 + 1],0xe0);
                iVar8 = (this_00->super_BTNode).used_links_count_;
                for (lVar7 = (long)(iVar4 + 2); iVar4 = iVar4 + 1, lVar7 < iVar8; lVar7 = lVar7 + 1)
                {
                  pBVar1 = this_00->links_[lVar7];
                  this_00->links_[lVar7 + -1] = pBVar1;
                  pBVar1->parent_ = &this_00->super_BTNode;
                  pBVar1->child_index_ = iVar4;
                }
                iVar8 = iVar8 + -1;
                (this_00->super_BTNode).used_links_count_ = iVar8;
                bVar3 = ll(this_00->links_,iVar8);
                if (bVar3) {
                  return true;
                }
                __assert_fail("ll(cur->links_, cur->used_links_count_)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                              ,0xf8,"bool storage::BTree::_erase_(int, Record *&)");
              }
              if (iVar8 == 2) {
                operator_delete(this_00->links_[1],0xe0);
                pBVar1 = this_00->links_[0];
                pBVar2->root_ = pBVar1;
                pBVar1->parent_ = (BTNode *)0x0;
                pBVar1->child_index_ = -1;
                operator_delete(this_00,0x278);
                return true;
              }
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0x100,"bool storage::BTree::_erase_(int, Record *&)");
            }
            operator_delete(pBVar1,0xe0);
          }
        }
      }
      else if (*out_record != (Record *)0x0) {
        __assert_fail("out_record == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                      ,0xdb,"bool storage::BTree::_erase_(int, Record *&)");
      }
    }
  }
  return local_41;
}

Assistant:

bool BTree::_erase_(int key, Record *&out_record) {
        if (!root_) {
            return false;   /* EMPTY */
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        if (node == root_) {
            auto leaf = dynamic_cast<BTLeafNode *>(node);
            if (leaf->key_count() > 1) {
                bool err = false;
                leaf->erase_(key, out_record, err);
                if (!err) {
                    assert(out_record == nullptr);
                    return false; // not exists
                } else
                    return true;

            } else if (leaf->key_count() == 1) {
                out_record = leaf->record_links_[0];
                delete root_;
                root_ = nullptr;
                return true;
            } else {
                assert(false);
            }
        }
        bool err = false;
        BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
        int idx = dynamic_cast<BTLeafNode *>(node)->erase_(key, out_record, err);
        if (!err) {
            assert(out_record == nullptr);
            return false; // not exists
        }

        BTInnerNode *cur = nullptr;
        while (idx != -1) {
            if (parent) {
                auto tt = parent->links_[idx + 1];
                BTInnerNode *nd = parent->erase_(idx, idx);
                if (!nd && idx != -1) {
                    assert(parent == root_);
                    cur = parent;
                    break;
                } else {
                    delete tt;
                    parent = nd;
                }
            }
        }
        if (cur) {
            if (cur->used_links_count_ > 2) {
                for (int i = idx + 1; i < cur->used_links_count_ - 1; ++i) {
                    cur->keys_[i - 1] = cur->keys_[i];
                }
                delete cur->links_[idx + 1];
                for (int i = idx + 2; i < cur->used_links_count_; ++i) {
                    cur->set_link(i - 1, cur->links_[i]);
                }
                cur->used_links_count_--;
                assert(ll(cur->links_, cur->used_links_count_));
            } else if (cur->used_links_count_ == 2) {
                delete cur->links_[1];
                root_ = cur->links_[0];
                root_->parent_ = nullptr;
                root_->child_index_ = -1;
                delete cur;
            } else {
                assert(false);
            }
        }
        return true;
    }